

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O0

int32_t stringIteratorMove(UCharIterator *iter,int32_t delta,UCharIteratorOrigin origin)

{
  int local_24;
  int32_t pos;
  UCharIteratorOrigin origin_local;
  int32_t delta_local;
  UCharIterator *iter_local;
  
  switch(origin) {
  case UITER_START:
    local_24 = iter->start + delta;
    break;
  case UITER_CURRENT:
    local_24 = iter->index + delta;
    break;
  case UITER_LIMIT:
    local_24 = iter->limit + delta;
    break;
  case UITER_ZERO:
    local_24 = delta;
    break;
  case UITER_LENGTH:
    local_24 = iter->length + delta;
    break;
  default:
    return -1;
  }
  if (local_24 < iter->start) {
    local_24 = iter->start;
  }
  else if (iter->limit < local_24) {
    local_24 = iter->limit;
  }
  iter->index = local_24;
  return local_24;
}

Assistant:

static int32_t U_CALLCONV
stringIteratorMove(UCharIterator *iter, int32_t delta, UCharIteratorOrigin origin) {
    int32_t pos;

    switch(origin) {
    case UITER_ZERO:
        pos=delta;
        break;
    case UITER_START:
        pos=iter->start+delta;
        break;
    case UITER_CURRENT:
        pos=iter->index+delta;
        break;
    case UITER_LIMIT:
        pos=iter->limit+delta;
        break;
    case UITER_LENGTH:
        pos=iter->length+delta;
        break;
    default:
        return -1;  /* Error */
    }

    if(pos<iter->start) {
        pos=iter->start;
    } else if(pos>iter->limit) {
        pos=iter->limit;
    }

    return iter->index=pos;
}